

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGTextFragmentsBuilder::build(SVGTextFragmentsBuilder *this,SVGTextElement *textElement)

{
  float fVar1;
  pointer pcVar2;
  ulong uVar3;
  SVGTextPositioningElement *this_00;
  vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>> *pvVar4;
  SVGTextFragmentIterator SVar5;
  bool bVar6;
  bool bVar7;
  SVGTextFragment *pSVar8;
  bool bVar9;
  int iVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  long lVar13;
  SVGTextFragment *fragment_1;
  pointer pSVar14;
  SVGTextFragmentIterator end;
  byte bVar15;
  size_t *__x;
  SVGTextFragment *pSVar16;
  iterator iVar17;
  SVGTextFragmentIterator begin;
  pointer pSVar18;
  byte bVar19;
  SVGCharacterPositions *this_01;
  SVGTextPosition *position;
  SVGTextPositioningElement *pSVar20;
  ulong uVar21;
  bool bVar22;
  byte bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  SVGTextFragment fragment;
  float local_110;
  ulong local_e8;
  float local_e0;
  float local_dc;
  u32string_view local_d0;
  pointer local_c0;
  Font *local_b8;
  size_t *local_b0;
  SVGCharacterPositions *local_a8;
  SVGTextFragment local_a0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar23 = 0;
  handleElement(this,&textElement->super_SVGTextPositioningElement);
  pSVar14 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar18 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar14 != pSVar18) {
    do {
      fillCharacterPositions(this,pSVar14);
      pSVar14 = pSVar14 + 1;
    } while (pSVar14 != pSVar18);
    pSVar14 = (this->m_textPositions).
              super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar18 = (this->m_textPositions).
              super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar14 != pSVar18) {
      pcVar2 = (this->m_text->_M_dataplus)._M_p;
      uVar3 = this->m_text->_M_string_length;
      this_01 = &this->m_characterPositions;
      __x = &this->m_characterOffset;
      local_c0 = pSVar18;
      local_b0 = __x;
      local_a8 = this_01;
      do {
        iVar10 = (*pSVar14->node->_vptr_SVGNode[2])();
        if ((char)iVar10 == '\0') goto LAB_00121345;
        this_00 = (SVGTextPositioningElement *)pSVar14->node->m_parentElement;
        if ((this_00 == (SVGTextPositioningElement *)0x0) ||
           (iVar10 = (*(this_00->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                       _vptr_SVGNode[7])(this_00), (char)iVar10 == '\0')) {
LAB_0012139c:
          __assert_fail("node && node->isTextPositioningElement()",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0x11,
                        "const SVGTextPositioningElement *lunasvg::toSVGTextPositioningElement(const SVGNode *)"
                       );
        }
        local_a0.element = this_00;
        Transform::Transform(&local_a0.lengthAdjustTransform);
        local_a0.x = 0.0;
        local_a0.y = 0.0;
        local_a0.angle = 0.0;
        local_a0.width = 0.0;
        local_a0.offset = 0;
        local_a0.length = 0;
        local_a0.startsNewTextChunk = false;
        if ((this_00->m_lengthAdjust).super_SVGProperty.field_0x9 == '\0') {
          bVar9 = SVGElement::hasAttribute((SVGElement *)this_00,TextLength);
        }
        else {
          bVar9 = false;
        }
        local_110 = this_00->m_baseline_offset;
        pSVar20 = this_00;
        while( true ) {
          pSVar20 = (SVGTextPositioningElement *)
                    (pSVar20->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                    m_parentElement;
          iVar10 = (*(pSVar20->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                     _vptr_SVGNode[7])(pSVar20);
          if ((char)iVar10 == '\0') break;
          iVar10 = (*(pSVar20->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                     _vptr_SVGNode[7])(pSVar20);
          if ((char)iVar10 == '\0') goto LAB_0012139c;
          local_110 = local_110 + pSVar20->m_baseline_offset;
        }
        if (Baseline < this_00->m_alignment_baseline) {
          switch(this_00->m_alignment_baseline) {
          case BeforeEdge:
          case TextBeforeEdge:
            goto switchD_00120f67_caseD_2;
          case Middle:
            goto switchD_00120f67_caseD_4;
          case Central:
            goto switchD_00120f67_caseD_5;
          case AfterEdge:
          case TextAfterEdge:
          case Ideographic:
            goto switchD_00120f67_caseD_6;
          case Alphabetic:
            goto switchD_00120f67_caseD_9;
          case Hanging:
            goto switchD_00120f67_caseD_a;
          case Mathematical:
            goto switchD_00120f67_caseD_b;
          default:
            goto switchD_00120f3b_caseD_0;
          }
        }
        switch(this_00->m_dominant_baseline) {
        case Auto:
        case UseScript:
        case NoChange:
        case ResetSize:
        case Alphabetic:
          goto switchD_00120f3b_caseD_0;
        case Ideographic:
        case TextAfterEdge:
switchD_00120f67_caseD_6:
          fVar24 = Font::descent(&this_00->m_font);
          goto LAB_00120fb4;
        case Hanging:
switchD_00120f67_caseD_a:
          fVar24 = Font::ascent(&this_00->m_font);
          fVar24 = (fVar24 * -8.0) / 10.0;
          goto LAB_00120ffc;
        case Mathematical:
switchD_00120f67_caseD_b:
          fVar24 = Font::ascent(&this_00->m_font);
          break;
        case Central:
switchD_00120f67_caseD_5:
          fVar25 = Font::ascent(&this_00->m_font);
          fVar24 = Font::descent(&this_00->m_font);
          fVar24 = fVar24 + fVar25;
          break;
        case Middle:
switchD_00120f67_caseD_4:
          fVar24 = Font::xHeight(&this_00->m_font);
          break;
        case TextBeforeEdge:
switchD_00120f67_caseD_2:
          fVar24 = Font::ascent(&this_00->m_font);
LAB_00120fb4:
          local_110 = local_110 - fVar24;
          goto switchD_00120f67_caseD_9;
        default:
          goto switchD_00120f3b_default;
        }
        fVar24 = fVar24 * -0.5;
LAB_00120ffc:
        local_110 = local_110 + fVar24;
switchD_00120f67_caseD_9:
switchD_00120f3b_caseD_0:
        uVar21 = pSVar14->startOffset;
        local_e8 = uVar21;
        if (uVar21 < pSVar14->endOffset) {
          local_b8 = &this_00->m_font;
          bVar7 = false;
          fVar24 = 0.0;
          do {
            sVar11 = std::
                     map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                     ::count(this_01,__x);
            if (sVar11 == 0) {
              bVar15 = 0;
              fVar26 = 0.0;
              fVar27 = 0.0;
              bVar19 = 0;
              fVar25 = 0.0;
            }
            else {
              pmVar12 = std::
                        map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                        ::at(this_01,__x);
              if (((pmVar12->rotate).super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
                fVar25 = 0.0;
              }
              else {
                fVar25 = (pmVar12->rotate).super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload._M_value;
              }
              local_dc = (pmVar12->x).super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload._M_value;
              bVar19 = (pmVar12->x).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_engaged;
              local_e0 = (pmVar12->y).super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload._M_value;
              bVar15 = (pmVar12->y).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_engaged;
              fVar26 = (pmVar12->dy).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
              if (((pmVar12->dx).super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
                fVar27 = 0.0;
              }
              else {
                fVar27 = (pmVar12->dx).super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload._M_value;
              }
              if (((pmVar12->dy).super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
                fVar26 = 0.0;
              }
            }
            if ((((bVar9 != false || (bVar19 & 1) != 0) ||
                 (((fVar25 != 0.0 | bVar15 | -(fVar27 != 0.0 || fVar26 != 0.0)) & 1) != 0)) ||
                (fVar25 != fVar24)) || (NAN(fVar25) || NAN(fVar24))) {
              bVar6 = true;
              if (bVar7) {
                local_58 = ZEXT416((uint)fVar27);
                local_48 = ZEXT416((uint)fVar26);
                if (uVar3 < local_e8) goto LAB_001213bb;
                local_d0._M_len = uVar21 - local_e8;
                if (uVar3 - local_e8 < uVar21 - local_e8) {
                  local_d0._M_len = uVar3 - local_e8;
                }
                local_d0._M_str = pcVar2 + local_e8;
                local_a0.offset = local_e8;
                local_a0.length = local_d0._M_len;
                fVar24 = Font::measureText(local_b8,&local_d0);
                local_a0.width = fVar24;
                pvVar4 = (vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>>
                          *)this->m_fragments;
                iVar17._M_current = *(SVGTextFragment **)(pvVar4 + 8);
                if (iVar17._M_current == *(SVGTextFragment **)(pvVar4 + 0x10)) {
                  std::vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>>::
                  _M_realloc_insert<lunasvg::SVGTextFragment_const&>(pvVar4,iVar17,&local_a0);
                }
                else {
                  pSVar16 = &local_a0;
                  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                    (iVar17._M_current)->element = pSVar16->element;
                    pSVar16 = (SVGTextFragment *)((long)pSVar16 + ((ulong)bVar23 * -2 + 1) * 8);
                    iVar17._M_current = iVar17._M_current + (ulong)bVar23 * -0x10 + 8;
                  }
                  *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x48;
                }
                this->m_x = local_a0.width + this->m_x;
                fVar26 = (float)local_48._0_4_;
                fVar27 = (float)local_58._0_4_;
                local_e8 = uVar21;
              }
            }
            else {
              bVar6 = false;
            }
            if (((bVar19 | bVar15) & 1) == 0) {
              bVar22 = false;
            }
            else {
              bVar22 = uVar21 == pSVar14->startOffset;
            }
            if ((bVar6 || bVar22 != false) || (!bVar7)) {
              fVar24 = local_dc;
              if ((bVar19 & 1) == 0) {
                fVar24 = this->m_x;
              }
              this->m_x = fVar27 + fVar24;
              fVar1 = local_e0;
              if ((bVar15 & 1) == 0) {
                fVar1 = this->m_y;
              }
              this->m_y = fVar26 + fVar1;
              local_a0.y = (fVar26 + fVar1) - local_110;
              local_a0.x = fVar27 + fVar24;
              local_a0.angle = fVar25;
              bVar7 = true;
              local_a0.startsNewTextChunk = bVar22;
            }
            *local_b0 = *local_b0 + 1;
            uVar21 = uVar21 + 1;
            __x = local_b0;
            this_01 = local_a8;
            fVar24 = fVar25;
          } while (uVar21 < pSVar14->endOffset);
        }
        if (uVar3 < local_e8) {
LAB_001213bb:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     local_e8,uVar3);
switchD_00120f3b_default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0x2e,
                        "AlignmentBaseline lunasvg::resolveDominantBaseline(const SVGTextPositioningElement *)"
                       );
        }
        local_d0._M_len = uVar21 - local_e8;
        if (uVar3 - local_e8 < uVar21 - local_e8) {
          local_d0._M_len = uVar3 - local_e8;
        }
        local_d0._M_str = pcVar2 + local_e8;
        local_a0.offset = local_e8;
        local_a0.length = local_d0._M_len;
        fVar24 = Font::measureText(&this_00->m_font,&local_d0);
        pSVar18 = local_c0;
        local_a0.width = fVar24;
        pvVar4 = (vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>> *)
                 this->m_fragments;
        iVar17._M_current = *(SVGTextFragment **)(pvVar4 + 8);
        if (iVar17._M_current == *(SVGTextFragment **)(pvVar4 + 0x10)) {
          std::vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>>::
          _M_realloc_insert<lunasvg::SVGTextFragment_const&>(pvVar4,iVar17,&local_a0);
        }
        else {
          pSVar16 = &local_a0;
          for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
            (iVar17._M_current)->element = pSVar16->element;
            pSVar16 = (SVGTextFragment *)((long)pSVar16 + ((ulong)bVar23 * -2 + 1) * 8);
            iVar17._M_current = iVar17._M_current + (ulong)bVar23 * -0x10 + 8;
          }
          *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x48;
        }
        this->m_x = local_a0.width + this->m_x;
LAB_00121345:
        pSVar14 = pSVar14 + 1;
      } while (pSVar14 != pSVar18);
    }
  }
  begin._M_current =
       (this->m_fragments->
       super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pSVar16 = (this->m_fragments->
            super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  SVar5._M_current = begin._M_current;
  if (begin._M_current != pSVar16) {
    while (end._M_current = SVar5._M_current + 1, end._M_current != pSVar16) {
      pSVar8 = SVar5._M_current + 1;
      SVar5._M_current = end._M_current;
      if (pSVar8->startsNewTextChunk == true) {
        handleTextChunk(begin,end);
        begin._M_current = end._M_current;
      }
    }
    handleTextChunk(begin,end);
  }
  return;
}

Assistant:

void SVGTextFragmentsBuilder::build(const SVGTextElement* textElement)
{
    handleElement(textElement);
    for(const auto& position : m_textPositions) {
        fillCharacterPositions(position);
    }

    std::u32string_view wholeText(m_text);
    for(const auto& textPosition : m_textPositions) {
        if(!textPosition.node->isTextNode())
            continue;
        auto element = toSVGTextPositioningElement(textPosition.node->parentElement());
        SVGTextFragment fragment(element);
        auto recordTextFragment = [&](auto startOffset, auto endOffset) {
            auto text = wholeText.substr(startOffset, endOffset - startOffset);
            fragment.offset = startOffset;
            fragment.length = text.length();
            fragment.width = element->font().measureText(text);
            m_fragments.push_back(fragment);
            m_x += fragment.width;
        };

        auto needsTextLengthSpacing = element->lengthAdjust() == LengthAdjust::Spacing && element->hasAttribute(PropertyID::TextLength);
        auto baselineOffset = calculateBaselineOffset(element);
        auto startOffset = textPosition.startOffset;
        auto textOffset = textPosition.startOffset;
        auto didStartTextFragment = false;
        auto lastAngle = 0.f;
        while(textOffset < textPosition.endOffset) {
            SVGCharacterPosition characterPosition;
            if(m_characterPositions.count(m_characterOffset) > 0) {
                characterPosition = m_characterPositions.at(m_characterOffset);
            }

            auto angle = characterPosition.rotate.value_or(0);
            auto dx = characterPosition.dx.value_or(0);
            auto dy = characterPosition.dy.value_or(0);

            auto shouldStartNewFragment = needsTextLengthSpacing || characterPosition.x || characterPosition.y || dx || dy || angle || angle != lastAngle;
            if(shouldStartNewFragment && didStartTextFragment) {
                recordTextFragment(startOffset, textOffset);
                startOffset = textOffset;
            }

            auto startsNewTextChunk = (characterPosition.x || characterPosition.y) && textOffset == textPosition.startOffset;
            if(startsNewTextChunk || shouldStartNewFragment || !didStartTextFragment) {
                m_x = dx + characterPosition.x.value_or(m_x);
                m_y = dy + characterPosition.y.value_or(m_y);
                fragment.x = m_x;
                fragment.y = m_y - baselineOffset;
                fragment.angle = angle;
                fragment.startsNewTextChunk = startsNewTextChunk;
                didStartTextFragment = true;
            }

            lastAngle = angle;
            ++textOffset;
            ++m_characterOffset;
        }

        recordTextFragment(startOffset, textOffset);
    }

    if(m_fragments.empty())
        return;
    auto it = m_fragments.begin();
    auto begin = m_fragments.begin();
    auto end = m_fragments.end();
    for(++it; it != end; ++it) {
        const SVGTextFragment& fragment = *it;
        if(!fragment.startsNewTextChunk)
            continue;
        handleTextChunk(begin, it);
        begin = it;
    }

    handleTextChunk(begin, it);
}